

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O3

void __thiscall
tf::Node::Node<std::in_place_type_t<tf::Node::Static>,std::function<void()>&>
          (Node *this,nstate_t nstate,estate_t estate,DefaultTaskParams *param_3,Topology *topology,
          Node *parent,size_t join_counter,in_place_type_t<tf::Node::Static> *args,
          function<void_()> *args_1)

{
  U *pUVar1;
  
  this->_nstate = nstate;
  (this->_estate).super___atomic_base<int>._M_i = estate;
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  this->_data = (void *)0x0;
  this->_topology = topology;
  this->_parent = parent;
  this->_num_successors = 0;
  pUVar1 = &(this->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  (this->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
  (this->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
  (this->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
       &this->_join_counter;
  (this->_join_counter).super___atomic_base<unsigned_long>._M_i = join_counter;
  std::function<void_()>::function((function<void_()> *)&this->_handle,args_1);
  *(__index_type *)
   ((long)&(this->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x38) = '\x01';
  (this->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  (this->_exception_ptr)._M_exception_object = (void *)0x0;
  return;
}

Assistant:

Node::Node(
  nstate_t nstate,
  estate_t estate,
  const DefaultTaskParams&,
  Topology* topology, 
  Node* parent, 
  size_t join_counter,
  Args&&... args
) :
  _nstate       {nstate},
  _estate       {estate},
  _topology     {topology},
  _parent       {parent},
  _join_counter {join_counter},
  _handle       {std::forward<Args>(args)...} {
}